

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O2

void av1_fwd_txfm2d_16x32_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  char cVar1;
  code *pcVar2;
  code *pcVar3;
  int8_t *piVar4;
  undefined7 in_register_00000009;
  ulong uVar5;
  long lVar6;
  long lVar7;
  int val;
  undefined8 uVar8;
  __m128i in [128];
  
  piVar4 = av1_fwd_txfm_shift_ls[9];
  uVar5 = (ulong)(uint)((int)CONCAT71(in_register_00000009,tx_type) << 3);
  pcVar2 = *(code **)((long)col_highbd_txfm8x32_arr + uVar5);
  pcVar3 = *(code **)((long)row_highbd_txfm8x32_arr + uVar5);
  load_buffer_16x16(input,in,stride,0,0,(int)*av1_fwd_txfm_shift_ls[9]);
  uVar8 = 0;
  load_buffer_16x16(input + (stride << 4),in + 0x40,stride,0,0,(int)*piVar4);
  for (lVar6 = 0; val = (int)uVar8, lVar6 != 0x40; lVar6 = lVar6 + 0x10) {
    lVar7 = (long)in[0] + lVar6;
    (*pcVar2)(lVar7,lVar7,0xc,4);
  }
  cVar1 = piVar4[1];
  col_txfm_16x16_rounding(in,-(int)cVar1);
  col_txfm_16x16_rounding(in + 0x40,-(int)cVar1);
  transpose_8nx8n(in,(__m128i *)coeff,0x10,0x20);
  (*pcVar3)(coeff,in,0xd,8);
  av1_round_shift_rect_array_32_sse4_1(in,(__m128i *)coeff,0x80,-(int)piVar4[2],val);
  return;
}

Assistant:

void av1_fwd_txfm2d_16x32_sse4_1(const int16_t *input, int32_t *coeff,
                                 int stride, TX_TYPE tx_type, int bd) {
  __m128i in[128];
  __m128i *outcoef128 = (__m128i *)coeff;
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_16X32];
  const int txw_idx = get_txw_idx(TX_16X32);
  const int txh_idx = get_txh_idx(TX_16X32);
  const fwd_transform_1d_sse4_1 col_txfm = col_highbd_txfm8x32_arr[tx_type];
  const fwd_transform_1d_sse4_1 row_txfm = row_highbd_txfm8x32_arr[tx_type];
  int bitcol = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int bitrow = av1_fwd_cos_bit_row[txw_idx][txh_idx];

  // column transform
  load_buffer_16x16(input, in, stride, 0, 0, shift[0]);
  load_buffer_16x16(input + 16 * stride, in + 64, stride, 0, 0, shift[0]);

  for (int i = 0; i < 4; i++) {
    col_txfm((in + i), (in + i), bitcol, 4);
  }
  col_txfm_16x16_rounding(&in[0], -shift[1]);
  col_txfm_16x16_rounding(&in[64], -shift[1]);
  transpose_8nx8n(in, outcoef128, 16, 32);

  // row transform
  row_txfm(outcoef128, in, bitrow, 8);
  av1_round_shift_rect_array_32_sse4_1(in, outcoef128, 128, -shift[2],
                                       NewSqrt2);
  (void)bd;
}